

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O0

tnt_iter * tnt_iter_array(tnt_iter *i,char *data,size_t size)

{
  int iVar1;
  tnt_iter *ptVar2;
  tnt_iter_array *itr;
  char *tmp_data;
  size_t size_local;
  char *data_local;
  tnt_iter *i_local;
  byte local_1a;
  byte local_19;
  char **ppcStack_18;
  uint8_t c;
  uint local_c;
  
  itr = (tnt_iter_array *)data;
  tmp_data = (char *)size;
  size_local = (size_t)data;
  data_local = (char *)i;
  iVar1 = mp_check((char **)&itr,data + size);
  if (iVar1 == 0) {
    if (((size_local == 0) || (tmp_data == (char *)0x0)) ||
       (local_1a = *(byte *)size_local, mp_type_hint[local_1a] != MP_ARRAY)) {
      i_local = (tnt_iter *)0x0;
    }
    else {
      ptVar2 = tnt_iter_init((tnt_iter *)data_local);
      if (ptVar2 == (tnt_iter *)0x0) {
        i_local = (tnt_iter *)0x0;
      }
      else {
        ptVar2->type = TNT_ITER_ARRAY;
        ptVar2->next = tnt_iter_array_next;
        ptVar2->rewind = tnt_iter_array_rewind;
        ptVar2->free = (_func_void_tnt_iter_ptr *)0x0;
        (ptVar2->data).array.data = (char *)size_local;
        (ptVar2->data).array.first_elem = (char *)size_local;
        ppcStack_18 = &(ptVar2->data).array.first_elem;
        data_local = (char *)ptVar2;
        local_19 = mp_load_u8(ppcStack_18);
        if ((local_19 & 0x40) == 0) {
          local_c = local_19 & 0xf;
        }
        else {
          local_c = mp_decode_array_slowpath(local_19,ppcStack_18);
        }
        (ptVar2->data).array.elem_count = local_c;
        (ptVar2->data).array.cur_index = -1;
        i_local = (tnt_iter *)data_local;
      }
    }
  }
  else {
    i_local = (tnt_iter *)0x0;
  }
  return i_local;
}

Assistant:

struct tnt_iter *
tnt_iter_array(struct tnt_iter *i, const char *data, size_t size)
{
	const char *tmp_data = data;
	if (mp_check(&tmp_data, data + size) != 0)
		return NULL;
	if (!data || !size || mp_typeof(*data) != MP_ARRAY)
		return NULL;
	i = tnt_iter_init(i);
	if (i == NULL)
		return NULL;
	i->type = TNT_ITER_ARRAY;
	i->next = tnt_iter_array_next;
	i->rewind = tnt_iter_array_rewind;
	i->free = NULL;
	struct tnt_iter_array *itr = TNT_IARRAY(i);
	itr->data = data;
	itr->first_elem = data;
	itr->elem_count = mp_decode_array(&itr->first_elem);
	itr->cur_index = -1;
	return i;
}